

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::VideoTrack::VetEntry(VideoTrack *this,BlockEntry *pBlockEntry)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  BlockEntry *in_RSI;
  Track *in_RDI;
  bool local_11;
  
  bVar1 = Track::VetEntry(in_RDI,in_RSI);
  local_11 = false;
  if (bVar1) {
    iVar2 = (*in_RSI->_vptr_BlockEntry[2])();
    local_11 = Block::IsKey((Block *)CONCAT44(extraout_var,iVar2));
  }
  return local_11;
}

Assistant:

bool VideoTrack::VetEntry(const BlockEntry* pBlockEntry) const {
  return Track::VetEntry(pBlockEntry) && pBlockEntry->GetBlock()->IsKey();
}